

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O0

void __thiscall
luna::RuntimeException::RuntimeException(RuntimeException *this,char *module,int line,char *desc)

{
  char **in_stack_00000178;
  char *in_stack_00000180;
  int *in_stack_00000188;
  char *in_stack_00000190;
  char **in_stack_00000198;
  Exception *in_stack_000001a0;
  
  Exception::Exception((Exception *)0x177d06);
  Exception::SetWhat<char_const*&,char,int&,char,char_const*&>
            (in_stack_000001a0,in_stack_00000198,in_stack_00000190,in_stack_00000188,
             in_stack_00000180,in_stack_00000178);
  return;
}

Assistant:

RuntimeException(const char *module, int line, const char *desc)
        {
            SetWhat(module, ':', line, ' ', desc);
        }